

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O2

int __thiscall
FNodeBuilder::FVertexMapSimple::SelectVertexClose(FVertexMapSimple *this,FPrivVert *vert)

{
  uint uVar1;
  ulong uVar2;
  fixed_t *pfVar3;
  uint uVar4;
  
  pfVar3 = &(((this->MyBuilder->Vertices).Array)->super_FSimpleVert).y;
  uVar2 = 0;
  do {
    if ((this->MyBuilder->Vertices).Count == uVar2) {
      vert->segs = 0xffffffff;
      vert->segs2 = 0xffffffff;
      uVar1 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::Push
                        (&this->MyBuilder->Vertices,vert);
      return uVar1;
    }
    uVar4 = ((FSimpleVert *)(pfVar3 + -1))->x - (vert->super_FSimpleVert).x;
    uVar1 = -uVar4;
    if (0 < (int)uVar4) {
      uVar1 = uVar4;
    }
    if (uVar1 < 6) {
      uVar4 = *pfVar3 - (vert->super_FSimpleVert).y;
      uVar1 = -uVar4;
      if (0 < (int)uVar4) {
        uVar1 = uVar4;
      }
      if (uVar1 < 6) {
        return (int)uVar2;
      }
    }
    uVar2 = uVar2 + 1;
    pfVar3 = pfVar3 + 4;
  } while( true );
}

Assistant:

int FNodeBuilder::FVertexMapSimple::SelectVertexClose(FNodeBuilder::FPrivVert &vert)
{
	FPrivVert *verts = &MyBuilder.Vertices[0];
	unsigned int stop = MyBuilder.Vertices.Size();

	for (unsigned int i = 0; i < stop; ++i)
	{
#if VERTEX_EPSILON <= 1
		if (verts[i].x == vert.x && verts[i].y == y)
#else
		if (abs(verts[i].x - vert.x) < VERTEX_EPSILON &&
			abs(verts[i].y - vert.y) < VERTEX_EPSILON)
#endif
		{
			return i;
		}
	}
	// Not present: add it!
	return InsertVertex (vert);
}